

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O2

bool __thiscall cmInstallSubdirectoryGenerator::HaveInstall(cmInstallSubdirectoryGenerator *this)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  pointer puVar4;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *generator;
  
  puVar1 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar4 = puVar2;
    if (puVar4 == puVar1) break;
    cVar3 = (**(code **)((long)(((puVar4->_M_t).
                                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                               super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x40))();
    puVar2 = puVar4 + 1;
  } while (cVar3 == '\0');
  return puVar4 != puVar1;
}

Assistant:

bool cmInstallSubdirectoryGenerator::HaveInstall()
{
  for (const auto& generator : this->Makefile->GetInstallGenerators()) {
    if (generator->HaveInstall()) {
      return true;
    }
  }

  return false;
}